

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_term.c
# Opt level: O0

int cmdTermGetch(void)

{
  int iVar1;
  int ch;
  termios newattr;
  termios oldattr;
  termios local_78;
  termios local_3c;
  
  fflush(_stdout);
  tcgetattr(0,&local_3c);
  memcpy(&local_78,&local_3c,0x3c);
  local_78.c_lflag = local_78.c_lflag & 0xfffffff5;
  local_78.c_cc[6] = '\x01';
  local_78.c_cc[5] = '\0';
  tcsetattr(0,0,&local_78);
  iVar1 = getchar();
  tcsetattr(0,0,&local_3c);
  return iVar1;
}

Assistant:

int cmdTermGetch()
{
	struct termios oldattr, newattr;
	int ch;
	fflush(stdout);
	tcgetattr(STDIN_FILENO, &oldattr);
	newattr = oldattr;
	newattr.c_lflag &= ~(ICANON | ECHO);
	newattr.c_cc[VMIN] = 1;
	newattr.c_cc[VTIME] = 0;
	tcsetattr(STDIN_FILENO, TCSANOW, &newattr);
	ch = getchar();
	tcsetattr(STDIN_FILENO, TCSANOW, &oldattr);
	return ch;
}